

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void lyxml_ctx_restore(lyxml_ctx *xmlctx,lyxml_ctx *backup)

{
  ly_in *plVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = 0;
  if (((xmlctx->status == LYXML_ATTR_CONTENT) || (xmlctx->status == LYXML_ELEM_CONTENT)) &&
     ((xmlctx->field_6).dynamic != '\0')) {
    free((xmlctx->field_3).prefix);
  }
  ly_set_erase(&xmlctx->elements,free);
  lyxml_ns_rm_all(xmlctx);
  plVar1 = xmlctx->in;
  plVar1->current = backup->b_current;
  plVar1->line = backup->b_line;
  backup->in = plVar1;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    xmlctx->ctx = backup->ctx;
    backup = (lyxml_ctx *)((long)backup + (ulong)bVar3 * -0x10 + 8);
    xmlctx = (lyxml_ctx *)((long)xmlctx + (ulong)bVar3 * -0x10 + 8);
  }
  return;
}

Assistant:

void
lyxml_ctx_restore(struct lyxml_ctx *xmlctx, struct lyxml_ctx *backup)
{
    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) && xmlctx->dynamic) {
        /* free dynamic value */
        free((char *)xmlctx->value);
    }

    /* free elements */
    ly_set_erase(&xmlctx->elements, free);

    /* free ns */
    lyxml_ns_rm_all(xmlctx);

    /* restore in */
    xmlctx->in->current = backup->b_current;
    xmlctx->in->line = backup->b_line;
    backup->in = xmlctx->in;

    /* restore backup */
    memcpy(xmlctx, backup, sizeof *xmlctx);
}